

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<std::function<void_()>,_0UL> * __thiscall
spirv_cross::SmallVector<std::function<void_()>,_0UL>::operator=
          (SmallVector<std::function<void_()>,_0UL> *this,
          SmallVector<std::function<void_()>,_0UL> *other)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  if (this != other) {
    clear(this);
    reserve(this,(other->super_VectorView<std::function<void_()>_>).buffer_size);
    lVar3 = 0;
    for (uVar2 = 0; uVar1 = (other->super_VectorView<std::function<void_()>_>).buffer_size,
        uVar2 < uVar1; uVar2 = uVar2 + 1) {
      ::std::function<void_()>::function
                ((function<void_()> *)
                 ((long)&(((this->super_VectorView<std::function<void_()>_>).ptr)->
                         super__Function_base)._M_functor + lVar3),
                 (function<void_()> *)
                 ((long)&(((other->super_VectorView<std::function<void_()>_>).ptr)->
                         super__Function_base)._M_functor + lVar3));
      lVar3 = lVar3 + 0x20;
    }
    (this->super_VectorView<std::function<void_()>_>).buffer_size = uVar1;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}